

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_std_suite.cpp
# Opt level: O0

void vector_suite::test_int8_two(void)

{
  iterator iVar1;
  iterator iVar2;
  undefined4 local_e8;
  undefined1 local_e4 [2];
  value_type local_e2 [2];
  output_type expected [4];
  vector<signed_char,_std::allocator<signed_char>_> value;
  undefined1 local_b8 [8];
  oarchive ar;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((oarchive *)local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20)
  ;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)expected);
  local_e2[1] = 0;
  std::vector<signed_char,_std::allocator<signed_char>_>::push_back
            ((vector<signed_char,_std::allocator<signed_char>_> *)expected,local_e2 + 1);
  local_e2[0] = '\x01';
  std::vector<signed_char,_std::allocator<signed_char>_>::push_back
            ((vector<signed_char,_std::allocator<signed_char>_> *)expected,local_e2);
  boost::archive::detail::interface_oarchive<trial::protocol::bintoken::oarchive>::operator<<
            ((interface_oarchive<trial::protocol::bintoken::oarchive> *)local_b8,
             (vector<signed_char,_std::allocator<signed_char>_> *)expected);
  local_e8 = 0x10002a8;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_std_suite.cpp"
             ,0x171,"void vector_suite::test_int8_two()",iVar1._M_current,iVar2._M_current,&local_e8
             ,local_e4);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)expected);
  trial::protocol::bintoken::oarchive::~oarchive((oarchive *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void test_int8_two()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    std::vector<std::int8_t> value;
    value.push_back(0);
    value.push_back(1);
    ar << value;

    output_type expected[] = { token::code::array8_int8, 0x02, 0x00, 0x01 };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<output_type>());
}